

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::ExceptionBreakpointsFilter>::construct
          (BasicTypeInfo<dap::ExceptionBreakpointsFilter> *this,void *ptr)

{
  memset(ptr,0,0xa0);
  ExceptionBreakpointsFilter::ExceptionBreakpointsFilter((ExceptionBreakpointsFilter *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }